

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

torrent_info * __thiscall
libtorrent::torrent_info::operator=(torrent_info *this,torrent_info *param_1)

{
  int32_t iVar1;
  torrent_info *param_1_local;
  torrent_info *this_local;
  
  file_storage::operator=(&this->m_files,&param_1->m_files);
  libtorrent::aux::copy_ptr<const_libtorrent::file_storage>::operator=
            (&this->m_orig_files,&param_1->m_orig_files);
  libtorrent::aux::
  container_wrapper<libtorrent::v1_2::announce_entry,_int,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  ::operator=(&this->m_urls,&param_1->m_urls);
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::operator=
            (&this->m_web_seeds,&param_1->m_web_seeds);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::operator=(&this->m_nodes,&param_1->m_nodes);
  ::std::vector<int,_std::allocator<int>_>::operator=
            (&this->m_similar_torrents,&param_1->m_similar_torrents);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::operator=
            (&this->m_owned_similar_torrents,&param_1->m_owned_similar_torrents);
  ::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
            (&this->m_collections,&param_1->m_collections);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_owned_collections,&param_1->m_owned_collections);
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<160L>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::operator=(&this->m_merkle_tree,&param_1->m_merkle_tree);
  libtorrent::aux::
  container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::operator=(&this->m_piece_layers,&param_1->m_piece_layers);
  boost::shared_array<char>::operator=(&this->m_info_section,&param_1->m_info_section);
  ::std::__cxx11::string::operator=((string *)&this->m_comment,(string *)&param_1->m_comment);
  ::std::__cxx11::string::operator=((string *)&this->m_created_by,(string *)&param_1->m_created_by);
  bdecode_node::operator=(&this->m_info_dict,&param_1->m_info_dict);
  this->m_creation_date = param_1->m_creation_date;
  memcpy(&this->m_info_hash,&param_1->m_info_hash,0x34);
  iVar1 = param_1->m_info_section_size;
  this->m_piece_hashes = param_1->m_piece_hashes;
  this->m_info_section_size = iVar1;
  (this->m_flags).m_val = (param_1->m_flags).m_val;
  return this;
}

Assistant:

bool torrent_info::resolve_duplicate_filenames(int const max_duplicate_filenames
		, error_code& ec)
	{
		INVARIANT_CHECK;

		std::unordered_set<std::uint32_t> files;

		std::string const empty_str;

		// insert all directories first, to make sure no files
		// are allowed to collied with them
		m_files.all_path_hashes(files);
		for (auto const i : m_files.file_range())
		{
			// as long as this file already exists
			// increase the counter
			std::uint32_t const h = m_files.file_path_hash(i, empty_str);
			if (!files.insert(h).second)
			{
				// This filename appears to already exist!
				// If this happens, just start over and do it the slow way,
				// comparing full file names and come up with new names
				return resolve_duplicate_filenames_slow(max_duplicate_filenames, ec);
			}
		}
		return true;
	}